

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::addConstraint
          (OptimalControlProblem *this,
          shared_ptr<iDynTree::optimalcontrol::LinearConstraint> *newConstraint)

{
  bool bVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  ConstraintsGroup *in_RDI;
  shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup> dummyGroup;
  shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup> *in_stack_00000280;
  OptimalControlProblem *in_stack_00000288;
  shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup> *in_stack_ffffffffffffff48;
  shared_ptr<iDynTree::optimalcontrol::LinearConstraint> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup> local_78 [3];
  undefined4 local_40;
  size_t local_30;
  __shared_ptr local_28 [39];
  byte local_1;
  
  __args = in_RSI;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RSI);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2f9390);
    Constraint::name_abi_cxx11_(&peVar2->super_Constraint);
    peVar2 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::LinearConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2f93a7);
    local_30 = Constraint::constraintSize(&peVar2->super_Constraint);
    std::
    make_shared<iDynTree::optimalcontrol::ConstraintsGroup,std::__cxx11::string_const&,unsigned_long>
              (__args,(unsigned_long *)in_RSI);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_28);
    if (bVar1) {
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2f9436);
      std::shared_ptr<iDynTree::optimalcontrol::LinearConstraint>::shared_ptr
                (in_stack_ffffffffffffff50,
                 (shared_ptr<iDynTree::optimalcontrol::LinearConstraint> *)in_stack_ffffffffffffff48
                );
      TimeRange::AnyTime();
      bVar1 = ConstraintsGroup::addConstraint
                        (in_RDI,(shared_ptr<iDynTree::optimalcontrol::LinearConstraint> *)__args,
                         (TimeRange *)in_RSI);
      std::shared_ptr<iDynTree::optimalcontrol::LinearConstraint>::~shared_ptr
                ((shared_ptr<iDynTree::optimalcontrol::LinearConstraint> *)0x2f9484);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup>::shared_ptr
                  (local_78,in_stack_ffffffffffffff48);
        local_1 = addGroupOfConstraints(in_stack_00000288,in_stack_00000280);
        std::shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup>::~shared_ptr
                  ((shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup> *)0x2f9503);
      }
      else {
        local_1 = 0;
      }
    }
    else {
      iDynTree::reportError("OptimalControlProblem","addConstraint","Failed in adding constraint.");
      local_1 = 0;
    }
    local_40 = 1;
    std::shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup>::~shared_ptr
              ((shared_ptr<iDynTree::optimalcontrol::ConstraintsGroup> *)0x2f9537);
  }
  else {
    iDynTree::reportError("OptimalControlProblem","addConstraint","Invalid constraint pointer.");
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OptimalControlProblem::addConstraint(std::shared_ptr<LinearConstraint> newConstraint)
        {
            if (!newConstraint){
                reportError("OptimalControlProblem", "addConstraint", "Invalid constraint pointer.");
                return false;
            }

            std::shared_ptr<ConstraintsGroup> dummyGroup =
                    std::make_shared<ConstraintsGroup>(newConstraint->name(),newConstraint->constraintSize());

            if(!dummyGroup){
                reportError("OptimalControlProblem", "addConstraint", "Failed in adding constraint.");
                return false;
            }

            if(!(dummyGroup->addConstraint(newConstraint, TimeRange::AnyTime()))){ //here is important to pass a LinearConstraint pointer
                return false;
            }
            return addGroupOfConstraints(dummyGroup);
        }